

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

Type __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
PushBack<long>(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *this,long value,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  bool bVar1;
  ushort uVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar3;
  Data local_18;
  
  local_18.s.str = (Ch *)0x96000000000000;
  if (value < 0) {
    uVar2 = 0xb6;
    if (value < -0x80000000) goto LAB_0015e35f;
  }
  else {
    bVar1 = (ulong)value >> 0x20 == 0;
    local_18.s.str = (Ch *)((ulong)bVar1 << 0x36 | 0x196000000000000);
    if (0x7fffffff < (ulong)value) goto LAB_0015e35f;
    uVar2 = (ushort)bVar1 << 6 | 0x1b6;
  }
  local_18.s.str = (Ch *)((ulong)uVar2 << 0x30);
LAB_0015e35f:
  local_18.n = (Number)value;
  pGVar3 = PushBack(this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_18.s,allocator);
  return pGVar3;
}

Assistant:

PushBack(T value, Allocator& allocator) {
        GenericValue v(value);
        return PushBack(v, allocator);
    }